

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

CeilLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_ceil(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x299) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x299;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    CeilLayerParams::CeilLayerParams(this_00.ceil_);
    (this->layer_).ceil_ = (CeilLayerParams *)this_00;
  }
  return (CeilLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::CeilLayerParams* NeuralNetworkLayer::mutable_ceil() {
  if (!has_ceil()) {
    clear_layer();
    set_has_ceil();
    layer_.ceil_ = new ::CoreML::Specification::CeilLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.ceil)
  return layer_.ceil_;
}